

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O1

void PatchOptimizeMaps::remove_useless_entities(World *world)

{
  mapped_type *ppMVar1;
  pointer puVar2;
  initializer_list<unsigned_short> __l;
  vector<unsigned_short,_std::allocator<unsigned_short>_> MAPS_TO_CLEAR_ENTITIES_FROM;
  allocator_type local_61;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  ulong local_48;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  undefined2 uStack_38;
  undefined8 uStack_36;
  
  uStack_38 = 0x61;
  uStack_36 = 0x5e00aa02730040;
  local_48 = 0x25901c6003b0037;
  uStack_40 = 0x55;
  uStack_3e = 0x6700600023;
  __l._M_len = 0xd;
  __l._M_array = (iterator)&local_48;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_60,__l,&local_61);
  if (local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar2 = local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_48 = CONCAT62(local_48._2_6_,*puVar2);
      ppMVar1 = std::
                map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
                ::at(&world->_maps,(key_type *)&local_48);
      Map::clear_entities(*ppMVar1);
      puVar2 = puVar2 + 1;
    } while (puVar2 != local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_48 = local_48 & 0xffffffffffff0000;
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,(key_type *)&local_48);
  Map::remove_entity(*ppMVar1,'\a',true);
  if (local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void remove_useless_entities(World& world)
    {
        const std::vector<uint16_t> MAPS_TO_CLEAR_ENTITIES_FROM = {
                MAP_MERCATOR_CASTLE_ENTRANCE_HALLWAY,
                MAP_MERCATOR_CASTLE_MAIN_HALL,
                MAP_ROUTE_GUMI_RYUMA_MERCATOR_GATES,
                MAP_GUMI_EXTERIOR,
                MAP_MERCATOR_CASTLE_BANQUET_ROOM,
                MAP_MECATOR_CASTLE_TOWER_SUMMIT,
                MAP_MERCATOR_CASTLE_ZAK_ROOM,
                MAP_MERCATOR_CASTLE_DEXTER_ROOM,
                MAP_MERCATOR_CASTLE_NIGEL_ROOM,
                MAP_MERCATOR_CASTLE_ARMORY_BARRACKS,
                MAP_RYUMA_LIGHTHOUSE, // Base Ryuma lighthouse (before Duke breaks it) is not reachable
                MAP_KN_CAVE_TELEPORTER_TO_KAZALT,
                MAP_MERCATOR_CASTLE_2F_HALLWAY
        };

        for(uint16_t map_id : MAPS_TO_CLEAR_ENTITIES_FROM)
            world.map(map_id)->clear_entities();

        // Remove a useless Miro from a map in Swamp Shrine
        world.map(MAP_SWAMP_SHRINE_0)->remove_entity(7);
    }